

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O2

void __thiscall
agge::tests::RendererTests::SubpixelPrecisionIsRespectedWhileRendering(RendererTests *this)

{
  cell *pcVar1;
  bool bVar2;
  int iVar3;
  cell *pcVar4;
  cell *pcVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  scanline_cells sVar9;
  scanline_cells sVar10;
  allocator local_181;
  scanline_mockup local_180;
  mask<11UL> mask2;
  LocationInfo local_130;
  string local_108;
  span reference2 [1];
  span reference1 [1];
  mask<7UL> mask1;
  cell cells21 [2];
  undefined1 local_80 [8];
  cell cells11 [2];
  undefined1 local_60 [8];
  scanline_cells cells2 [1];
  scanline_cells cells1 [1];
  
  local_180.excepted_y = -1000000;
  local_180.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_180.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_180.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_180.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_180._25_8_ = 0;
  local_180._current_y = 0x7fffffff;
  cells1[0].second = (cell *)local_60;
  cells11[0].x = 0;
  cells11[0].area = 0;
  cells11[0].cover = 0x11;
  cells11[1].x = 0xb;
  cells11[1].area = 0;
  cells11[1].cover = -0x11;
  cells1[0].first = cells11;
  mocks::mask<7ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,1>
            ((mask<7ul> *)&mask1,&cells1,0xd);
  iVar7 = mask1._min_y;
  do {
    if (mask1._height + mask1._min_y <= iVar7) {
      reference1[0].y = 0xd;
      reference1[0].x = 0;
      reference1[0].length = 0xb;
      reference1[0].cover = 0x1100;
      std::__cxx11::string::string
                ((string *)&local_130,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                 ,(allocator *)&local_108);
      ut::LocationInfo::LocationInfo((LocationInfo *)&mask2,&local_130.filename,0x196);
      ut::
      are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                (&reference1,&local_180.spans_log,(LocationInfo *)&mask2);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      cells2[0].second = (cell *)local_80;
      cells21[0].x = 2;
      cells21[0].area = 0;
      cells21[0].cover = 0x11;
      cells21[1].x = 10;
      cells21[1].area = 0;
      cells21[1].cover = -0x11;
      cells2[0].first = cells21;
      mocks::mask<11ul>::
      mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,1>
                ((mask<11ul> *)&mask2,&cells2,0x17);
      local_180.spans_log.
      super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ =
           SUB81(local_180.spans_log.
                 super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                 ._M_impl.super__Vector_impl_data._M_start,0);
      local_180.spans_log.
      super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
           (undefined7)
           ((ulong)local_180.spans_log.
                   super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 8);
      iVar7 = mask2._min_y;
      do {
        if (mask2._height + mask2._min_y <= iVar7) {
          reference2[0].y = 0x17;
          reference2[0].x = 2;
          reference2[0].length = 8;
          reference2[0].cover = 0x11000;
          std::__cxx11::string::string
                    ((string *)&local_108,
                     "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                     ,&local_181);
          ut::LocationInfo::LocationInfo(&local_130,&local_108,0x1a7);
          ut::
          are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                    (&reference2,&local_180.spans_log,&local_130);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::
          _Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
          ::~_Vector_base(&mask2._cells.
                           super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                         );
          std::
          _Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
          ::~_Vector_base(&mask1._cells.
                           super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                         );
          anon_unknown_1::scanline_mockup::~scanline_mockup(&local_180);
          return;
        }
        sVar10 = mocks::mask<11UL>::operator[](&mask2,iVar7);
        pcVar5 = sVar10.second;
        pcVar4 = sVar10.first;
        bVar2 = anon_unknown_1::scanline_mockup::begin(&local_180,iVar7);
        if (bVar2) {
          if (pcVar4 != pcVar5) {
            uVar8 = 0;
LAB_001802c1:
            iVar6 = pcVar4->x;
            iVar3 = 0;
            pcVar1 = pcVar4;
            do {
              pcVar4 = pcVar1 + 1;
              iVar3 = iVar3 + pcVar1->area;
              uVar8 = uVar8 + pcVar1->cover;
              if (pcVar4 == pcVar5) break;
              pcVar1 = pcVar4;
            } while (pcVar4->x == iVar6);
            if (iVar3 != 0) {
              anon_unknown_1::scanline_mockup::add_cell(&local_180,iVar6,uVar8 * 0x1000 - iVar3);
              iVar6 = iVar6 + 1;
            }
            if (pcVar4 != pcVar5) {
              iVar3 = pcVar4->x - iVar6;
              if ((uVar8 & 0xfffff) != 0 && iVar3 != 0) {
                anon_unknown_1::scanline_mockup::add_span(&local_180,iVar6,iVar3,uVar8 * 0x1000);
              }
              goto LAB_001802c1;
            }
          }
          anon_unknown_1::scanline_mockup::commit(&local_180);
        }
        iVar7 = iVar7 + 1;
      } while( true );
    }
    sVar9 = mocks::mask<7UL>::operator[](&mask1,iVar7);
    pcVar5 = sVar9.second;
    pcVar4 = sVar9.first;
    bVar2 = anon_unknown_1::scanline_mockup::begin(&local_180,iVar7);
    if (bVar2) {
      if (pcVar4 != pcVar5) {
        uVar8 = 0;
LAB_00180135:
        iVar6 = pcVar4->x;
        iVar3 = 0;
        pcVar1 = pcVar4;
        do {
          pcVar4 = pcVar1 + 1;
          iVar3 = iVar3 + pcVar1->area;
          uVar8 = uVar8 + pcVar1->cover;
          if (pcVar4 == pcVar5) break;
          pcVar1 = pcVar4;
        } while (pcVar4->x == iVar6);
        if (iVar3 != 0) {
          anon_unknown_1::scanline_mockup::add_cell(&local_180,iVar6,uVar8 * 0x100 - iVar3);
          iVar6 = iVar6 + 1;
        }
        if (pcVar4 != pcVar5) {
          iVar3 = pcVar4->x - iVar6;
          if ((uVar8 & 0xffffff) != 0 && iVar3 != 0) {
            anon_unknown_1::scanline_mockup::add_span(&local_180,iVar6,iVar3,uVar8 * 0x100);
          }
          goto LAB_00180135;
        }
      }
      anon_unknown_1::scanline_mockup::commit(&local_180);
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

scanline_mockup(bool inprogress = true)
					: excepted_y(-1000000), _inprogress(inprogress), _current_y(0x7fffffff)
				{	}